

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void ra_left(ASMState *as,Reg dest,IRRef lref)

{
  IRIns *ir;
  byte bVar1;
  Reg src;
  RegSet allow;
  
  ir = as->ir + lref;
  bVar1 = (ir->field_1).r;
  src = (Reg)bVar1;
  if ((char)bVar1 < '\0') {
    if (lref < 0x8000) {
      switch((ir->field_1).o) {
      case '\x16':
        break;
      default:
        emit_loadi(as,dest,ir->i);
        return;
      case '\x18':
      case '\x19':
      case '\x1a':
      case '\x1d':
switchD_0013fe9c_caseD_18:
        emit_loadk64(as,dest,ir);
        return;
      case '\x1c':
        if ((ir[1] == (IRIns)0x0) || (as->freeset < 0x10000)) goto switchD_0013fe9c_caseD_18;
      }
    }
    if ((0xfc < bVar1) && (as->sectref <= lref)) {
      (ir->field_1).r = (byte)dest | 0x80;
    }
    allow = 0xffff0000;
    if (dest < 0x10) {
      allow = 0xbfef;
    }
    src = ra_allocref(as,lref,allow);
  }
  bVar1 = (byte)src & 0x1f;
  as->weakset = as->weakset & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
  if (src == dest) {
    return;
  }
  if ((((ir->field_1).t.irt & 0x40) != 0) && (as->phireg[dest] == lref)) {
    as->modset = as->modset | 1 << ((byte)src & 0x1f);
    ra_rename(as,src,dest);
    return;
  }
  emit_movrr(as,ir,dest,src);
  return;
}

Assistant:

static void ra_left(ASMState *as, Reg dest, IRRef lref)
{
  IRIns *ir = IR(lref);
  Reg left = ir->r;
  if (ra_noreg(left)) {
    if (irref_isk(lref)) {
      if (ir->o == IR_KNUM) {
	/* FP remat needs a load except for +0. Still better than eviction. */
	if (tvispzero(ir_knum(ir)) || !(as->freeset & RSET_FPR)) {
	  emit_loadk64(as, dest, ir);
	  return;
	}
#if LJ_64
      } else if (ir->o == IR_KINT64) {
	emit_loadk64(as, dest, ir);
	return;
#if LJ_GC64
      } else if (ir->o == IR_KGC || ir->o == IR_KPTR || ir->o == IR_KKPTR) {
	emit_loadk64(as, dest, ir);
	return;
#endif
#endif
      } else if (ir->o != IR_KPRI) {
	lj_assertA(ir->o == IR_KINT || ir->o == IR_KGC ||
		   ir->o == IR_KPTR || ir->o == IR_KKPTR || ir->o == IR_KNULL,
		   "K%03d has bad IR op %d", REF_BIAS - lref, ir->o);
	emit_loadi(as, dest, ir->i);
	return;
      }
    }
    if (!ra_hashint(left) && !iscrossref(as, lref))
      ra_sethint(ir->r, dest);  /* Propagate register hint. */
    left = ra_allocref(as, lref, dest < RID_MAX_GPR ? RSET_GPR : RSET_FPR);
  }
  ra_noweak(as, left);
  /* Move needed for true 3-operand instruction: y=a+b ==> y=a; y+=b. */
  if (dest != left) {
    /* Use register renaming if dest is the PHI reg. */
    if (irt_isphi(ir->t) && as->phireg[dest] == lref) {
      ra_modified(as, left);
      ra_rename(as, left, dest);
    } else {
      emit_movrr(as, ir, dest, left);
    }
  }
}